

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

Bit32u __thiscall MT32Emu::Synth::getPartStates(Synth *this)

{
  Bit32u BVar1;
  int partNumber;
  uint uVar2;
  bool partStates [9];
  
  BVar1 = 0;
  if (this->opened == true) {
    getPartStates(this,partStates);
    BVar1 = 0;
    for (uVar2 = 8; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
      BVar1 = (uint)partStates[uVar2] + BVar1 * 2;
    }
  }
  return BVar1;
}

Assistant:

Bit32u Synth::getPartStates() const {
	if (!opened) return 0;
	bool partStates[9];
	getPartStates(partStates);
	Bit32u bitSet = 0;
	for (int partNumber = 8; partNumber >= 0; partNumber--) {
		bitSet = (bitSet << 1) | (partStates[partNumber] ? 1 : 0);
	}
	return bitSet;
}